

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chkder_.c
# Opt level: O2

void chkder_(int *m,int *n,double *x,double *fvec,double *fjac,int *ldfjac,double *xp,double *fvecp,
            int *mode,double *err)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  double *pdVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  ulong extraout_XMM0_Qb;
  double __x;
  int c__1;
  double local_58;
  double local_48;
  ulong uStack_40;
  
  c__1 = 1;
  uVar8 = (ulong)*ldfjac;
  dVar10 = dpmpar_(&c__1);
  if (dVar10 < 0.0) {
    local_58 = sqrt(dVar10);
  }
  else {
    local_58 = SQRT(dVar10);
  }
  if (*mode == 2) {
    dVar11 = log(local_58);
    uVar4 = 0;
    uVar6 = (ulong)(uint)*m;
    if (*m < 1) {
      uVar6 = uVar4;
    }
    for (; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      err[uVar4] = 0.0;
    }
    iVar3 = *n;
    if (iVar3 < 1) {
      iVar3 = 0;
    }
    pdVar5 = fjac + uVar8 + ~uVar8 + 1;
    for (uVar4 = 1; uVar4 != iVar3 + 1; uVar4 = uVar4 + 1) {
      dVar12 = x[uVar4 - 1];
      uVar9 = -(ulong)(dVar12 == 0.0);
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        err[uVar7] = pdVar5[uVar7] *
                     (double)(uVar9 & 0x3ff0000000000000 | ~uVar9 & (ulong)ABS(dVar12)) + err[uVar7]
        ;
      }
      pdVar5 = pdVar5 + uVar8;
    }
    local_48 = -(dVar11 * 0.4342944819032518);
    uStack_40 = extraout_XMM0_Qb ^ 0x8000000000000000;
    dVar12 = local_58;
    for (uVar8 = 0; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      dVar1 = fvec[uVar8];
      __x = 1.0;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        dVar2 = fvecp[uVar8];
        __x = 1.0;
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          __x = 1.0;
          if (dVar10 * 100.0 * ABS(dVar1) <= ABS(dVar2 - dVar1)) {
            __x = (ABS((dVar2 - dVar1) / dVar12 - err[uVar8]) * dVar12) / (ABS(dVar2) + ABS(dVar1));
          }
        }
      }
      err[uVar8] = 1.0;
      if ((dVar10 < __x) && (__x < dVar12)) {
        dVar12 = log(__x);
        err[uVar8] = (dVar12 * 0.4342944819032518 + local_48) / (dVar11 * 0.4342944819032518);
        dVar12 = local_58;
      }
      if (dVar12 <= __x) {
        err[uVar8] = 0.0;
      }
    }
  }
  else {
    uVar6 = 0;
    uVar8 = (ulong)(uint)*n;
    if (*n < 1) {
      uVar8 = uVar6;
    }
    for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      dVar10 = ABS(x[uVar6]) * local_58;
      uVar4 = -(ulong)(dVar10 == 0.0);
      xp[uVar6] = (double)(uVar4 & (ulong)local_58 | ~uVar4 & (ulong)dVar10) + x[uVar6];
    }
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(chkder)(const int *m, const int *n, const real *x, 
	real *fvec, real *fjac, const int *ldfjac, real *xp, 
	real *fvecp, const int *mode, real *err)
{
    /* Initialized data */

    const int c__1 = 1;

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;

    /* Local variables */
    int i__, j;
    real eps, epsf, temp, epsmch;
    real epslog;

/*     ********** */

/*     subroutine chkder */

/*     this subroutine checks the gradients of m nonlinear functions */
/*     in n variables, evaluated at a point x, for consistency with */
/*     the functions themselves. the user must call chkder twice, */
/*     first with mode = 1 and then with mode = 2. */

/*     mode = 1. on input, x must contain the point of evaluation. */
/*               on output, xp is set to a neighboring point. */

/*     mode = 2. on input, fvec must contain the functions and the */
/*                         rows of fjac must contain the gradients */
/*                         of the respective functions each evaluated */
/*                         at x, and fvecp must contain the functions */
/*                         evaluated at xp. */
/*               on output, err contains measures of correctness of */
/*                          the respective gradients. */

/*     the subroutine does not perform reliably if cancellation or */
/*     rounding errors cause a severe loss of significance in the */
/*     evaluation of a function. therefore, none of the components */
/*     of x should be unusually small (in particular, zero) or any */
/*     other value which may cause loss of significance. */

/*     the subroutine statement is */

/*       subroutine chkder(m,n,x,fvec,fjac,ldfjac,xp,fvecp,mode,err) */

/*     where */

/*       m is a positive integer input variable set to the number */
/*         of functions. */

/*       n is a positive integer input variable set to the number */
/*         of variables. */

/*       x is an input array of length n. */

/*       fvec is an array of length m. on input when mode = 2, */
/*         fvec must contain the functions evaluated at x. */

/*       fjac is an m by n array. on input when mode = 2, */
/*         the rows of fjac must contain the gradients of */
/*         the respective functions evaluated at x. */

/*       ldfjac is a positive integer input parameter not less than m */
/*         which specifies the leading dimension of the array fjac. */

/*       xp is an array of length n. on output when mode = 1, */
/*         xp is set to a neighboring point of x. */

/*       fvecp is an array of length m. on input when mode = 2, */
/*         fvecp must contain the functions evaluated at xp. */

/*       mode is an integer input variable set to 1 on the first call */
/*         and 2 on the second. other values of mode are equivalent */
/*         to mode = 1. */

/*       err is an array of length m. on output when mode = 2, */
/*         err contains measures of correctness of the respective */
/*         gradients. if there is no severe loss of significance, */
/*         then if err(i) is 1.0 the i-th gradient is correct, */
/*         while if err(i) is 0.0 the i-th gradient is incorrect. */
/*         for values of err between 0.0 and 1.0, the categorization */
/*         is less certain. in general, a value of err(i) greater */
/*         than 0.5 indicates that the i-th gradient is probably */
/*         correct, while a value of err(i) less than 0.5 indicates */
/*         that the i-th gradient is probably incorrect. */

/*     subprograms called */

/*       minpack supplied ... dpmpar */

/*       fortran supplied ... dabs,dlog10,dsqrt */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --err;
    --fvecp;
    --fvec;
    --xp;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    eps = sqrt(epsmch);

    if (*mode == 2) {
	goto L20;
    }

/*        mode = 1. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	temp = eps * fabs(x[j]);
	if (temp == 0.) {
	    temp = eps;
	}
	xp[j] = x[j] + temp;
/* L10: */
    }
    /* goto L70; */
    return;
L20:

/*        mode = 2. */

    epsf = factor * epsmch;
    epslog = log10e * log(eps);
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	err[i__] = 0.;
/* L30: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	temp = fabs(x[j]);
	if (temp == 0.) {
	    temp = 1.;
	}
	i__2 = *m;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    err[i__] += temp * fjac[i__ + j * fjac_dim1];
/* L40: */
	}
/* L50: */
    }
    i__1 = *m;
    for (i__ = 1; i__ <= i__1; ++i__) {
	temp = 1.;
	if (fvec[i__] != 0. && fvecp[i__] != 0. && fabs(fvecp[i__] - 
		fvec[i__]) >= epsf * fabs(fvec[i__]))
		 {
	    temp = eps * fabs((fvecp[i__] - fvec[i__]) / eps - err[i__]) 
		    / (fabs(fvec[i__]) +
                       fabs(fvecp[i__]));
	}
	err[i__] = 1.;
	if (temp > epsmch && temp < eps) {
	    err[i__] = (log10e * log(temp) - epslog) / epslog;
	}
	if (temp >= eps) {
	    err[i__] = 0.;
	}
/* L60: */
    }
/* L70: */

    /* return 0; */

/*     last card of subroutine chkder. */

}